

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::DPIExportSyntax::setChild(DPIExportSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 in_RDX;
  
  (*(code *)(&DAT_005357c8 + *(int *)(&DAT_005357c8 + index * 4)))
            (&child,index,in_RDX,&DAT_005357c8 + *(int *)(&DAT_005357c8 + index * 4));
  return;
}

Assistant:

void DPIExportSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: specString = child.token(); return;
        case 3: c_identifier = child.token(); return;
        case 4: equals = child.token(); return;
        case 5: functionOrTask = child.token(); return;
        case 6: name = child.token(); return;
        case 7: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}